

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_add_static_string_option(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  char b [10];
  char *args [3];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[2] = "abc";
    args[0]._0_4_ = 0x127be1;
    args[0]._4_4_ = 0;
    args[1]._0_4_ = 0x127b8a;
    args[1]._4_4_ = 0;
    iVar1 = cargo_add_option(cargo,0,"--beta -b","Description",".s#",b,10);
    if (iVar1 == 0) {
      iVar1 = cargo_parse(cargo,0,1,3,args);
      if (iVar1 == 0) {
        puts("Attempt to parse value: abc");
        pcVar2 = (char *)0x0;
        if (b._0_4_ != 0x636261) {
          pcVar2 = "Failed to parse correct value abc";
        }
      }
      else {
        pcVar2 = "Failed to parse static char * with value \"abc\"";
      }
    }
    else {
      pcVar2 = "Failed to add valid static string option";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_add_static_string_option)
{
    char b[10];
    char *args[] = { "program", "--beta", "abc" };
    ret = cargo_add_option(cargo, 0, "--beta -b",
                            "Description",
                            ".s#",
                            &b, sizeof(b));
    cargo_assert(ret == 0, "Failed to add valid static string option");

    if (cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args))
    {
        msg = "Failed to parse static char * with value \"abc\"";
        goto fail;
    }
    printf("Attempt to parse value: abc\n");
    cargo_assert(!strcmp(b, "abc"), "Failed to parse correct value abc");
    _TEST_CLEANUP();
}